

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_event_epoll.c
# Opt level: O2

int mk_event_wait_2(mk_event_loop *loop,int timeout)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  int line;
  
  piVar1 = (int *)loop->data;
  do {
    iVar2 = epoll_wait(*piVar1,*(epoll_event **)(piVar1 + 2),piVar1[1],timeout);
    if (-1 < iVar2) goto LAB_00112082;
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  mk_utils_libc_error("epoll_wait",(char *)0x1c1,line);
LAB_00112082:
  loop->n_events = iVar2;
  return iVar2;
}

Assistant:

static inline int _mk_event_wait_2(struct mk_event_loop *loop, int timeout)
{
    struct mk_event_ctx *ctx = loop->data;
    int ret = 0;

    while(1) {
        ret = epoll_wait(ctx->efd, ctx->events, ctx->queue_size, timeout);
        if (ret >= 0) {
            break;
        }
        else if(ret < 0 && errno != EINTR) {
            mk_libc_error("epoll_wait");
            break;
        }
        /* retry when errno is EINTR */
    }
    loop->n_events = ret;
    return ret;
}